

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O0

leb_Node leb_DecodeNode(leb_Heap *leb,uint32_t nodeID)

{
  leb_Node node_00;
  uint32_t uVar1;
  uint32_t b;
  uint32_t cmp;
  uint local_1c;
  uint32_t nodeID_local;
  leb_Heap *leb_local;
  leb_Node node;
  
  uVar1 = leb_NodeCount(leb);
  if (uVar1 <= nodeID) {
    __assert_fail("nodeID < leb_NodeCount(leb) && \"nodeID > NodeCount(leb)\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                  ,0x300,"leb_Node leb_DecodeNode(const leb_Heap *, uint32_t)");
  }
  leb_local = (leb_Heap *)0x1;
  local_1c = nodeID;
  while (uVar1 = leb__HeapRead(leb,(leb_Node)leb_local), 1 < uVar1) {
    node_00.depth = leb_local._4_4_ + 1;
    node_00.id = (int)leb_local << 1;
    uVar1 = leb__HeapRead(leb,node_00);
    leb_local = (leb_Heap *)
                CONCAT44(leb_local._4_4_ + 1,(uint)(uVar1 <= local_1c) | (int)leb_local << 1);
    local_1c = local_1c - uVar1 * (uVar1 <= local_1c);
  }
  return (leb_Node)leb_local;
}

Assistant:

LEBDEF leb_Node leb_DecodeNode(const leb_Heap *leb, uint32_t nodeID)
{
    LEB_ASSERT(nodeID < leb_NodeCount(leb) && "nodeID > NodeCount(leb)");

    leb_Node node = {1u, 0};

    while (leb__HeapRead(leb, node) > 1u) {
        uint32_t cmp = leb__HeapRead(leb, {node.id<<= 1u, ++node.depth});
        uint32_t b = nodeID < cmp ? 0 : 1;

        node.id|= b;
        nodeID-= cmp * b;
    }

    return node;
}